

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O1

void anon_unknown.dwarf_4379a::ALbandpass_setParamf(ALfilter *filter,ALenum param,float val)

{
  filter_exception *this;
  
  if (param == 3) {
    if ((0.0 <= val) && (val <= 1.0)) {
      filter->GainHF = val;
      return;
    }
    this = (filter_exception *)__cxa_allocate_exception(0x30);
    filter_exception::filter_exception(this,0xa003,"Band-pass gainhf %f out of range",(double)val);
  }
  else if (param == 2) {
    if ((0.0 <= val) && (val <= 1.0)) {
      filter->GainLF = val;
      return;
    }
    this = (filter_exception *)__cxa_allocate_exception(0x30);
    filter_exception::filter_exception(this,0xa003,"Band-pass gainlf %f out of range",(double)val);
  }
  else if (param == 1) {
    if ((0.0 <= val) && (val <= 4.0)) {
      filter->Gain = val;
      return;
    }
    this = (filter_exception *)__cxa_allocate_exception(0x30);
    filter_exception::filter_exception(this,0xa003,"Band-pass gain %f out of range",(double)val);
  }
  else {
    this = (filter_exception *)__cxa_allocate_exception(0x30);
    filter_exception::filter_exception
              (this,0xa002,"Invalid band-pass float property 0x%04x",(ulong)(uint)param);
  }
  __cxa_throw(this,&(anonymous_namespace)::filter_exception::typeinfo,
              al::base_exception::~base_exception);
}

Assistant:

void ALbandpass_setParamf(ALfilter *filter, ALenum param, float val)
{
    switch(param)
    {
    case AL_BANDPASS_GAIN:
        if(!(val >= FILTER_MIN_GAIN && val <= FILTER_MAX_GAIN))
            throw filter_exception{AL_INVALID_VALUE, "Band-pass gain %f out of range", val};
        filter->Gain = val;
        break;

    case AL_BANDPASS_GAINHF:
        if(!(val >= AL_BANDPASS_MIN_GAINHF && val <= AL_BANDPASS_MAX_GAINHF))
            throw filter_exception{AL_INVALID_VALUE, "Band-pass gainhf %f out of range", val};
        filter->GainHF = val;
        break;

    case AL_BANDPASS_GAINLF:
        if(!(val >= AL_BANDPASS_MIN_GAINLF && val <= AL_BANDPASS_MAX_GAINLF))
            throw filter_exception{AL_INVALID_VALUE, "Band-pass gainlf %f out of range", val};
        filter->GainLF = val;
        break;

    default:
        throw filter_exception{AL_INVALID_ENUM, "Invalid band-pass float property 0x%04x", param};
    }
}